

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

Key_Func __thiscall
Fl_Text_Editor::bound_key_function(Fl_Text_Editor *this,int key,int state,Key_Binding *list)

{
  Key_Binding *local_30;
  Key_Binding *cur;
  Key_Binding *list_local;
  int state_local;
  int key_local;
  Fl_Text_Editor *this_local;
  
  for (local_30 = list;
      (local_30 != (Key_Binding *)0x0 &&
      ((local_30->key != key || ((local_30->state != -1 && (local_30->state != state))))));
      local_30 = local_30->next) {
  }
  if (local_30 == (Key_Binding *)0x0) {
    this_local = (Fl_Text_Editor *)0x0;
  }
  else {
    this_local = (Fl_Text_Editor *)local_30->function;
  }
  return (Key_Func)this_local;
}

Assistant:

Fl_Text_Editor::Key_Func Fl_Text_Editor::bound_key_function(int key, int state, Key_Binding* list) const
#endif
{
  Key_Binding* cur;
  for (cur = list; cur; cur = cur->next)
    if (cur->key == key)
      if (cur->state == FL_TEXT_EDITOR_ANY_STATE || cur->state == state)
        break;
  if (!cur) return 0;
  return cur->function;
}